

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

char * nifti_image_to_ascii(nifti_image *nim)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int ii;
  int ii_00;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  int k;
  int j;
  int i;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (nim != (nifti_image *)0x0) {
    pcVar4 = (char *)calloc(1,0xfffe);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "** NITA: failed to alloc %d bytes\n";
      uVar9 = 0xfffe;
    }
    else {
      builtin_strncpy(pcVar4,"<nifti_image\n",0xe);
      sVar5 = strlen(pcVar4);
      iVar2 = nim->nifti_type;
      if (iVar2 == 1) {
        pcVar8 = "NIFTI-1+";
      }
      else if (iVar2 == 2) {
        pcVar8 = "NIFTI-1";
      }
      else {
        pcVar8 = "ANALYZE-7.5";
        if (iVar2 == 3) {
          pcVar8 = "NIFTI-1A";
        }
      }
      sprintf(pcVar4 + sVar5,"  nifti_type = \'%s\'\n",pcVar8);
      pcVar8 = escapize_string(nim->fname);
      sVar5 = strlen(pcVar4);
      sprintf(pcVar4 + sVar5,"  header_filename = %s\n",pcVar8);
      free(pcVar8);
      pcVar8 = escapize_string(nim->iname);
      sVar5 = strlen(pcVar4);
      sprintf(pcVar4 + sVar5,"  image_filename = %s\n",pcVar8);
      free(pcVar8);
      sVar5 = strlen(pcVar4);
      sprintf(pcVar4 + sVar5,"  image_offset = \'%d\'\n",(ulong)(uint)nim->iname_offset);
      sVar5 = strlen(pcVar4);
      sprintf(pcVar4 + sVar5,"  ndim = \'%d\'\n",(ulong)(uint)nim->ndim);
      sVar5 = strlen(pcVar4);
      sprintf(pcVar4 + sVar5,"  nx = \'%d\'\n",(ulong)(uint)nim->nx);
      if (1 < nim->ndim) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  ny = \'%d\'\n",(ulong)(uint)nim->ny);
        if (2 < nim->ndim) {
          sVar5 = strlen(pcVar4);
          sprintf(pcVar4 + sVar5,"  nz = \'%d\'\n",(ulong)(uint)nim->nz);
          if (3 < nim->ndim) {
            sVar5 = strlen(pcVar4);
            sprintf(pcVar4 + sVar5,"  nt = \'%d\'\n",(ulong)(uint)nim->nt);
            if (4 < nim->ndim) {
              sVar5 = strlen(pcVar4);
              sprintf(pcVar4 + sVar5,"  nu = \'%d\'\n",(ulong)(uint)nim->nu);
              if (5 < nim->ndim) {
                sVar5 = strlen(pcVar4);
                sprintf(pcVar4 + sVar5,"  nv = \'%d\'\n",(ulong)(uint)nim->nv);
                if (6 < nim->ndim) {
                  sVar5 = strlen(pcVar4);
                  sprintf(pcVar4 + sVar5,"  nw = \'%d\'\n",(ulong)(uint)nim->nw);
                }
              }
            }
          }
        }
      }
      sVar5 = strlen(pcVar4);
      sprintf(pcVar4 + sVar5,"  dx = \'%g\'\n",SUB84((double)nim->dx,0));
      if (1 < nim->ndim) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  dy = \'%g\'\n",SUB84((double)nim->dy,0));
        if (2 < nim->ndim) {
          sVar5 = strlen(pcVar4);
          sprintf(pcVar4 + sVar5,"  dz = \'%g\'\n",SUB84((double)nim->dz,0));
          if (3 < nim->ndim) {
            sVar5 = strlen(pcVar4);
            sprintf(pcVar4 + sVar5,"  dt = \'%g\'\n",SUB84((double)nim->dt,0));
            if (4 < nim->ndim) {
              sVar5 = strlen(pcVar4);
              sprintf(pcVar4 + sVar5,"  du = \'%g\'\n",SUB84((double)nim->du,0));
              if (5 < nim->ndim) {
                sVar5 = strlen(pcVar4);
                sprintf(pcVar4 + sVar5,"  dv = \'%g\'\n",SUB84((double)nim->dv,0));
                if (6 < nim->ndim) {
                  sVar5 = strlen(pcVar4);
                  sprintf(pcVar4 + sVar5,"  dw = \'%g\'\n",SUB84((double)nim->dw,0));
                }
              }
            }
          }
        }
      }
      sVar5 = strlen(pcVar4);
      sprintf(pcVar4 + sVar5,"  datatype = \'%d\'\n",(ulong)(uint)nim->datatype);
      sVar5 = strlen(pcVar4);
      pcVar8 = nifti_datatype_string(nim->datatype);
      sprintf(pcVar4 + sVar5,"  datatype_name = \'%s\'\n",pcVar8);
      sVar5 = strlen(pcVar4);
      sprintf(pcVar4 + sVar5,"  nvox = \'%u\'\n",(ulong)(uint)nim->nvox);
      sVar5 = strlen(pcVar4);
      sprintf(pcVar4 + sVar5,"  nbyper = \'%d\'\n",(ulong)(uint)nim->nbyper);
      sVar5 = strlen(pcVar4);
      pcVar8 = "LSB_FIRST";
      if (nim->byteorder == 2) {
        pcVar8 = "MSB_FIRST";
      }
      sprintf(pcVar4 + sVar5,"  byteorder = \'%s\'\n",pcVar8);
      fVar1 = nim->cal_min;
      if (fVar1 < nim->cal_max) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  cal_min = \'%g\'\n",SUB84((double)fVar1,0));
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  cal_max = \'%g\'\n",SUB84((double)nim->cal_max,0));
      }
      fVar1 = nim->scl_slope;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  scl_slope = \'%g\'\n",SUB84((double)fVar1,0));
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  scl_inter = \'%g\'\n",SUB84((double)nim->scl_inter,0));
      }
      uVar10 = nim->intent_code;
      if (0 < (int)uVar10) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  intent_code = \'%d\'\n",(ulong)uVar10);
        sVar5 = strlen(pcVar4);
        pcVar8 = nifti_intent_string(nim->intent_code);
        sprintf(pcVar4 + sVar5,"  intent_code_name = \'%s\'\n",pcVar8);
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  intent_p1 = \'%g\'\n",SUB84((double)nim->intent_p1,0));
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  intent_p2 = \'%g\'\n",SUB84((double)nim->intent_p2,0));
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  intent_p3 = \'%g\'\n",SUB84((double)nim->intent_p3,0));
        if (nim->intent_name[0] != '\0') {
          pcVar8 = escapize_string(nim->intent_name);
          sVar5 = strlen(pcVar4);
          sprintf(pcVar4 + sVar5,"  intent_name = %s\n",pcVar8);
          free(pcVar8);
        }
      }
      fVar1 = nim->toffset;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  toffset = \'%g\'\n",SUB84((double)fVar1,0));
      }
      uVar10 = nim->xyz_units;
      if (0 < (int)uVar10) {
        sVar5 = strlen(pcVar4);
        pcVar8 = nifti_units_string(uVar10);
        sprintf(pcVar4 + sVar5,"  xyz_units = \'%d\'\n  xyz_units_name = \'%s\'\n",(ulong)uVar10,
                pcVar8);
      }
      uVar10 = nim->time_units;
      if (0 < (int)uVar10) {
        sVar5 = strlen(pcVar4);
        pcVar8 = nifti_units_string(uVar10);
        sprintf(pcVar4 + sVar5,"  time_units = \'%d\'\n  time_units_name = \'%s\'\n",(ulong)uVar10,
                pcVar8);
      }
      uVar10 = nim->freq_dim;
      if (0 < (int)uVar10) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  freq_dim = \'%d\'\n",(ulong)uVar10);
      }
      uVar10 = nim->phase_dim;
      if (0 < (int)uVar10) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  phase_dim = \'%d\'\n",(ulong)uVar10);
      }
      uVar10 = nim->slice_dim;
      if (0 < (int)uVar10) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  slice_dim = \'%d\'\n",(ulong)uVar10);
      }
      uVar10 = nim->slice_code;
      if (0 < (int)uVar10) {
        sVar5 = strlen(pcVar4);
        pcVar8 = nifti_slice_string(uVar10);
        sprintf(pcVar4 + sVar5,"  slice_code = \'%d\'\n  slice_code_name = \'%s\'\n",(ulong)uVar10,
                pcVar8);
      }
      uVar10 = nim->slice_start;
      if ((-1 < (int)uVar10) && (uVar3 = nim->slice_end, (int)uVar10 < (int)uVar3)) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  slice_start = \'%d\'\n  slice_end = \'%d\'\n",(ulong)uVar10,
                (ulong)uVar3);
      }
      fVar1 = nim->slice_duration;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  slice_duration = \'%g\'\n",SUB84((double)fVar1,0));
      }
      if (nim->descrip[0] != '\0') {
        pcVar8 = escapize_string(nim->descrip);
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  descrip = %s\n",pcVar8);
        free(pcVar8);
      }
      if (nim->aux_file[0] != '\0') {
        pcVar8 = escapize_string(nim->aux_file);
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,"  aux_file = %s\n",pcVar8);
        free(pcVar8);
      }
      uVar10 = nim->qform_code;
      if (0 < (int)uVar10) {
        sVar5 = strlen(pcVar4);
        pcVar8 = nifti_xform_string(uVar10);
        sprintf(pcVar4 + sVar5,
                "  qform_code = \'%d\'\n  qform_code_name = \'%s\'\n  qto_xyz_matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n"
                ,SUB84((double)(nim->qto_xyz).m[0][0],0),SUB84((double)(nim->qto_xyz).m[0][1],0),
                SUB84((double)(nim->qto_xyz).m[0][2],0),SUB84((double)(nim->qto_xyz).m[0][3],0),
                (double)(nim->qto_xyz).m[1][0],(double)(nim->qto_xyz).m[1][1],
                (double)(nim->qto_xyz).m[1][2],(double)(nim->qto_xyz).m[1][3],(ulong)uVar10,pcVar8);
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,
                "  qto_ijk_matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n",
                SUB84((double)(nim->qto_ijk).m[0][0],0),SUB84((double)(nim->qto_ijk).m[0][1],0),
                SUB84((double)(nim->qto_ijk).m[0][2],0),SUB84((double)(nim->qto_ijk).m[0][3],0),
                (double)(nim->qto_ijk).m[1][0],(double)(nim->qto_ijk).m[1][1],
                (double)(nim->qto_ijk).m[1][2],(double)(nim->qto_ijk).m[1][3]);
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,
                "  quatern_b = \'%g\'\n  quatern_c = \'%g\'\n  quatern_d = \'%g\'\n  qoffset_x = \'%g\'\n  qoffset_y = \'%g\'\n  qoffset_z = \'%g\'\n  qfac = \'%g\'\n"
                ,SUB84((double)nim->quatern_b,0),SUB84((double)nim->quatern_c,0),
                SUB84((double)nim->quatern_d,0),SUB84((double)nim->qoffset_x,0),
                (double)nim->qoffset_y,(double)nim->qoffset_z,(double)nim->qfac);
        local_78 = *(undefined8 *)(nim->qto_xyz).m[0];
        uStack_70 = *(undefined8 *)((nim->qto_xyz).m[0] + 2);
        local_68 = *(undefined8 *)(nim->qto_xyz).m[1];
        uStack_60 = *(undefined8 *)((nim->qto_xyz).m[1] + 2);
        local_58 = *(undefined8 *)(nim->qto_xyz).m[2];
        uStack_50 = *(undefined8 *)((nim->qto_xyz).m[2] + 2);
        local_48 = *(undefined8 *)(nim->qto_xyz).m[3];
        uStack_40 = *(undefined8 *)((nim->qto_xyz).m[3] + 2);
        nifti_mat44_to_orientation((mat44)*&(nim->qto_xyz).m,&i,&j,&k);
        ii_00 = i;
        ii = j;
        iVar2 = k;
        if (0 < k && (0 < j && 0 < i)) {
          sVar5 = strlen(pcVar4);
          pcVar8 = nifti_orientation_string(ii_00);
          pcVar6 = nifti_orientation_string(ii);
          pcVar7 = nifti_orientation_string(iVar2);
          sprintf(pcVar4 + sVar5,
                  "  qform_i_orientation = \'%s\'\n  qform_j_orientation = \'%s\'\n  qform_k_orientation = \'%s\'\n"
                  ,pcVar8,pcVar6,pcVar7);
        }
      }
      uVar10 = nim->sform_code;
      if (0 < (int)uVar10) {
        sVar5 = strlen(pcVar4);
        pcVar8 = nifti_xform_string(uVar10);
        sprintf(pcVar4 + sVar5,
                "  sform_code = \'%d\'\n  sform_code_name = \'%s\'\n  sto_xyz_matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n"
                ,SUB84((double)(nim->sto_xyz).m[0][0],0),SUB84((double)(nim->sto_xyz).m[0][1],0),
                SUB84((double)(nim->sto_xyz).m[0][2],0),SUB84((double)(nim->sto_xyz).m[0][3],0),
                (double)(nim->sto_xyz).m[1][0],(double)(nim->sto_xyz).m[1][1],
                (double)(nim->sto_xyz).m[1][2],(double)(nim->sto_xyz).m[1][3],(ulong)uVar10,pcVar8);
        sVar5 = strlen(pcVar4);
        sprintf(pcVar4 + sVar5,
                "  sto_ijk matrix = \'%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g\'\n",
                SUB84((double)(nim->sto_ijk).m[0][0],0),SUB84((double)(nim->sto_ijk).m[0][1],0),
                SUB84((double)(nim->sto_ijk).m[0][2],0),SUB84((double)(nim->sto_ijk).m[0][3],0),
                (double)(nim->sto_ijk).m[1][0],(double)(nim->sto_ijk).m[1][1],
                (double)(nim->sto_ijk).m[1][2],(double)(nim->sto_ijk).m[1][3]);
        local_78 = *(undefined8 *)(nim->sto_xyz).m[0];
        uStack_70 = *(undefined8 *)((nim->sto_xyz).m[0] + 2);
        local_68 = *(undefined8 *)(nim->sto_xyz).m[1];
        uStack_60 = *(undefined8 *)((nim->sto_xyz).m[1] + 2);
        local_58 = *(undefined8 *)(nim->sto_xyz).m[2];
        uStack_50 = *(undefined8 *)((nim->sto_xyz).m[2] + 2);
        local_48 = *(undefined8 *)(nim->sto_xyz).m[3];
        uStack_40 = *(undefined8 *)((nim->sto_xyz).m[3] + 2);
        nifti_mat44_to_orientation((mat44)*&(nim->sto_xyz).m,&i,&j,&k);
        if (0 < k && (0 < j && 0 < i)) {
          sVar5 = strlen(pcVar4);
          pcVar8 = nifti_orientation_string(i);
          pcVar6 = nifti_orientation_string(j);
          pcVar7 = nifti_orientation_string(k);
          sprintf(pcVar4 + sVar5,
                  "  sform_i_orientation = \'%s\'\n  sform_j_orientation = \'%s\'\n  sform_k_orientation = \'%s\'\n"
                  ,pcVar8,pcVar6,pcVar7);
        }
      }
      sVar5 = strlen(pcVar4);
      sprintf(pcVar4 + sVar5,"  num_ext = \'%d\'\n",(ulong)(uint)nim->num_ext);
      sVar5 = strlen(pcVar4);
      builtin_strncpy(pcVar4 + sVar5,"/>\n",4);
      sVar5 = strlen(pcVar4);
      uVar10 = (int)sVar5 + 1;
      pcVar4 = (char *)realloc(pcVar4,(long)(int)uVar10);
      if (pcVar4 != (char *)0x0) {
        return pcVar4;
      }
      pcVar4 = "** NITA: failed to realloc %d bytes\n";
      uVar9 = (ulong)uVar10;
    }
    fprintf(_stderr,pcVar4,uVar9);
  }
  return (char *)0x0;
}

Assistant:

char *nifti_image_to_ascii( const nifti_image *nim )
{
   char *buf , *ebuf ; int nbuf ;

   if( nim == NULL ) return NULL ;   /* stupid caller */

   buf = (char *)calloc(1,65534); nbuf = 0; /* longer than needed, to be safe */
   if( !buf ){
      fprintf(stderr,"** NITA: failed to alloc %d bytes\n",65534);
      return NULL;
   }

   sprintf( buf , "<nifti_image\n" ) ;   /* XML-ish opener */

   sprintf( buf+strlen(buf) , "  nifti_type = '%s'\n" ,
              (nim->nifti_type == NIFTI_FTYPE_NIFTI1_1) ? "NIFTI-1+"
             :(nim->nifti_type == NIFTI_FTYPE_NIFTI1_2) ? "NIFTI-1"
             :(nim->nifti_type == NIFTI_FTYPE_ASCII   ) ? "NIFTI-1A"
             :                         "ANALYZE-7.5" ) ;

   /** Strings that we don't control (filenames, etc.) that might
       contain "weird" characters (like quotes) are "escaped":
       - A few special characters are replaced by XML-style escapes, using
         the function escapize_string().
       - On input, function unescape_string() reverses this process.
       - The result is that the NIFTI ASCII-format header is XML-compliant. */

   ebuf = escapize_string(nim->fname) ;
   sprintf( buf+strlen(buf) , "  header_filename = %s\n",ebuf); free(ebuf);

   ebuf = escapize_string(nim->iname) ;
   sprintf( buf+strlen(buf) , "  image_filename = %s\n", ebuf); free(ebuf);

   sprintf( buf+strlen(buf) , "  image_offset = '%d'\n" , nim->iname_offset );

                       sprintf( buf+strlen(buf), "  ndim = '%d'\n", nim->ndim);
                       sprintf( buf+strlen(buf), "  nx = '%d'\n",   nim->nx  );
   if( nim->ndim > 1 ) sprintf( buf+strlen(buf), "  ny = '%d'\n",   nim->ny  );
   if( nim->ndim > 2 ) sprintf( buf+strlen(buf), "  nz = '%d'\n",   nim->nz  );
   if( nim->ndim > 3 ) sprintf( buf+strlen(buf), "  nt = '%d'\n",   nim->nt  );
   if( nim->ndim > 4 ) sprintf( buf+strlen(buf), "  nu = '%d'\n",   nim->nu  );
   if( nim->ndim > 5 ) sprintf( buf+strlen(buf), "  nv = '%d'\n",   nim->nv  );
   if( nim->ndim > 6 ) sprintf( buf+strlen(buf), "  nw = '%d'\n",   nim->nw  );
                       sprintf( buf+strlen(buf), "  dx = '%g'\n",   nim->dx  );
   if( nim->ndim > 1 ) sprintf( buf+strlen(buf), "  dy = '%g'\n",   nim->dy  );
   if( nim->ndim > 2 ) sprintf( buf+strlen(buf), "  dz = '%g'\n",   nim->dz  );
   if( nim->ndim > 3 ) sprintf( buf+strlen(buf), "  dt = '%g'\n",   nim->dt  );
   if( nim->ndim > 4 ) sprintf( buf+strlen(buf), "  du = '%g'\n",   nim->du  );
   if( nim->ndim > 5 ) sprintf( buf+strlen(buf), "  dv = '%g'\n",   nim->dv  );
   if( nim->ndim > 6 ) sprintf( buf+strlen(buf), "  dw = '%g'\n",   nim->dw  );

   sprintf( buf+strlen(buf) , "  datatype = '%d'\n" , nim->datatype ) ;
   sprintf( buf+strlen(buf) , "  datatype_name = '%s'\n" ,
                              nifti_datatype_string(nim->datatype) ) ;

   sprintf( buf+strlen(buf) , "  nvox = '%u'\n" , (unsigned)nim->nvox ) ;
   sprintf( buf+strlen(buf) , "  nbyper = '%d'\n" , nim->nbyper ) ;

   sprintf( buf+strlen(buf) , "  byteorder = '%s'\n" ,
            (nim->byteorder==MSB_FIRST) ? "MSB_FIRST" : "LSB_FIRST" ) ;

   if( nim->cal_min < nim->cal_max ){
     sprintf( buf+strlen(buf) , "  cal_min = '%g'\n", nim->cal_min ) ;
     sprintf( buf+strlen(buf) , "  cal_max = '%g'\n", nim->cal_max ) ;
   }

   if( nim->scl_slope != 0.0 ){
     sprintf( buf+strlen(buf) , "  scl_slope = '%g'\n" , nim->scl_slope ) ;
     sprintf( buf+strlen(buf) , "  scl_inter = '%g'\n" , nim->scl_inter ) ;
   }

   if( nim->intent_code > 0 ){
     sprintf( buf+strlen(buf) , "  intent_code = '%d'\n", nim->intent_code ) ;
     sprintf( buf+strlen(buf) , "  intent_code_name = '%s'\n" ,
                                nifti_intent_string(nim->intent_code) ) ;
     sprintf( buf+strlen(buf) , "  intent_p1 = '%g'\n" , nim->intent_p1 ) ;
     sprintf( buf+strlen(buf) , "  intent_p2 = '%g'\n" , nim->intent_p2 ) ;
     sprintf( buf+strlen(buf) , "  intent_p3 = '%g'\n" , nim->intent_p3 ) ;

     if( nim->intent_name[0] != '\0' ){
       ebuf = escapize_string(nim->intent_name) ;
       sprintf( buf+strlen(buf) , "  intent_name = %s\n",ebuf) ;
       free(ebuf) ;
     }
   }

   if( nim->toffset != 0.0 )
     sprintf( buf+strlen(buf) , "  toffset = '%g'\n",nim->toffset ) ;

   if( nim->xyz_units > 0 )
     sprintf( buf+strlen(buf) ,
              "  xyz_units = '%d'\n"
              "  xyz_units_name = '%s'\n" ,
              nim->xyz_units , nifti_units_string(nim->xyz_units) ) ;

   if( nim->time_units > 0 )
     sprintf( buf+strlen(buf) ,
              "  time_units = '%d'\n"
              "  time_units_name = '%s'\n" ,
              nim->time_units , nifti_units_string(nim->time_units) ) ;

   if( nim->freq_dim > 0 )
     sprintf( buf+strlen(buf) , "  freq_dim = '%d'\n",nim->freq_dim ) ;
   if( nim->phase_dim > 0 )
     sprintf( buf+strlen(buf) , "  phase_dim = '%d'\n",nim->phase_dim ) ;
   if( nim->slice_dim > 0 )
     sprintf( buf+strlen(buf) , "  slice_dim = '%d'\n",nim->slice_dim ) ;
   if( nim->slice_code > 0 )
     sprintf( buf+strlen(buf) ,
              "  slice_code = '%d'\n"
              "  slice_code_name = '%s'\n" ,
              nim->slice_code , nifti_slice_string(nim->slice_code) ) ;
   if( nim->slice_start >= 0 && nim->slice_end > nim->slice_start )
     sprintf( buf+strlen(buf) ,
              "  slice_start = '%d'\n"
              "  slice_end = '%d'\n"  , nim->slice_start , nim->slice_end ) ;
   if( nim->slice_duration != 0.0 )
     sprintf( buf+strlen(buf) , "  slice_duration = '%g'\n",
              nim->slice_duration ) ;

   if( nim->descrip[0] != '\0' ){
     ebuf = escapize_string(nim->descrip) ;
     sprintf( buf+strlen(buf) , "  descrip = %s\n",ebuf) ;
     free(ebuf) ;
   }

   if( nim->aux_file[0] != '\0' ){
     ebuf = escapize_string(nim->aux_file) ;
     sprintf( buf+strlen(buf) , "  aux_file = %s\n",ebuf) ;
     free(ebuf) ;
   }

   if( nim->qform_code > 0 ){
     int i,j,k ;

     sprintf( buf+strlen(buf) ,
              "  qform_code = '%d'\n"
              "  qform_code_name = '%s'\n"
     "  qto_xyz_matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->qform_code      , nifti_xform_string(nim->qform_code) ,
         nim->qto_xyz.m[0][0] , nim->qto_xyz.m[0][1] ,
         nim->qto_xyz.m[0][2] , nim->qto_xyz.m[0][3] ,
         nim->qto_xyz.m[1][0] , nim->qto_xyz.m[1][1] ,
         nim->qto_xyz.m[1][2] , nim->qto_xyz.m[1][3] ,
         nim->qto_xyz.m[2][0] , nim->qto_xyz.m[2][1] ,
         nim->qto_xyz.m[2][2] , nim->qto_xyz.m[2][3] ,
         nim->qto_xyz.m[3][0] , nim->qto_xyz.m[3][1] ,
         nim->qto_xyz.m[3][2] , nim->qto_xyz.m[3][3]  ) ;

     sprintf( buf+strlen(buf) ,
     "  qto_ijk_matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->qto_ijk.m[0][0] , nim->qto_ijk.m[0][1] ,
         nim->qto_ijk.m[0][2] , nim->qto_ijk.m[0][3] ,
         nim->qto_ijk.m[1][0] , nim->qto_ijk.m[1][1] ,
         nim->qto_ijk.m[1][2] , nim->qto_ijk.m[1][3] ,
         nim->qto_ijk.m[2][0] , nim->qto_ijk.m[2][1] ,
         nim->qto_ijk.m[2][2] , nim->qto_ijk.m[2][3] ,
         nim->qto_ijk.m[3][0] , nim->qto_ijk.m[3][1] ,
         nim->qto_ijk.m[3][2] , nim->qto_ijk.m[3][3]  ) ;

     sprintf( buf+strlen(buf) ,
              "  quatern_b = '%g'\n"
              "  quatern_c = '%g'\n"
              "  quatern_d = '%g'\n"
              "  qoffset_x = '%g'\n"
              "  qoffset_y = '%g'\n"
              "  qoffset_z = '%g'\n"
              "  qfac = '%g'\n" ,
         nim->quatern_b , nim->quatern_c , nim->quatern_d ,
         nim->qoffset_x , nim->qoffset_y , nim->qoffset_z , nim->qfac ) ;

     nifti_mat44_to_orientation( nim->qto_xyz , &i,&j,&k ) ;
     if( i > 0 && j > 0 && k > 0 )
       sprintf( buf+strlen(buf) ,
                "  qform_i_orientation = '%s'\n"
                "  qform_j_orientation = '%s'\n"
                "  qform_k_orientation = '%s'\n" ,
                nifti_orientation_string(i) ,
                nifti_orientation_string(j) ,
                nifti_orientation_string(k)  ) ;
   }

   if( nim->sform_code > 0 ){
     int i,j,k ;

     sprintf( buf+strlen(buf) ,
              "  sform_code = '%d'\n"
              "  sform_code_name = '%s'\n"
     "  sto_xyz_matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->sform_code      , nifti_xform_string(nim->sform_code) ,
         nim->sto_xyz.m[0][0] , nim->sto_xyz.m[0][1] ,
         nim->sto_xyz.m[0][2] , nim->sto_xyz.m[0][3] ,
         nim->sto_xyz.m[1][0] , nim->sto_xyz.m[1][1] ,
         nim->sto_xyz.m[1][2] , nim->sto_xyz.m[1][3] ,
         nim->sto_xyz.m[2][0] , nim->sto_xyz.m[2][1] ,
         nim->sto_xyz.m[2][2] , nim->sto_xyz.m[2][3] ,
         nim->sto_xyz.m[3][0] , nim->sto_xyz.m[3][1] ,
         nim->sto_xyz.m[3][2] , nim->sto_xyz.m[3][3]  ) ;

     sprintf( buf+strlen(buf) ,
     "  sto_ijk matrix = '%g %g %g %g %g %g %g %g %g %g %g %g %g %g %g %g'\n" ,
         nim->sto_ijk.m[0][0] , nim->sto_ijk.m[0][1] ,
         nim->sto_ijk.m[0][2] , nim->sto_ijk.m[0][3] ,
         nim->sto_ijk.m[1][0] , nim->sto_ijk.m[1][1] ,
         nim->sto_ijk.m[1][2] , nim->sto_ijk.m[1][3] ,
         nim->sto_ijk.m[2][0] , nim->sto_ijk.m[2][1] ,
         nim->sto_ijk.m[2][2] , nim->sto_ijk.m[2][3] ,
         nim->sto_ijk.m[3][0] , nim->sto_ijk.m[3][1] ,
         nim->sto_ijk.m[3][2] , nim->sto_ijk.m[3][3]  ) ;

     nifti_mat44_to_orientation( nim->sto_xyz , &i,&j,&k ) ;
     if( i > 0 && j > 0 && k > 0 )
       sprintf( buf+strlen(buf) ,
                "  sform_i_orientation = '%s'\n"
                "  sform_j_orientation = '%s'\n"
                "  sform_k_orientation = '%s'\n" ,
                nifti_orientation_string(i) ,
                nifti_orientation_string(j) ,
                nifti_orientation_string(k)  ) ;
   }

   sprintf( buf+strlen(buf) , "  num_ext = '%d'\n", nim->num_ext ) ;

   sprintf( buf+strlen(buf) , "/>\n" ) ;   /* XML-ish closer */

   nbuf = (int)strlen(buf) ;
   buf  = (char *)realloc((void *)buf, nbuf+1); /* cut back to proper length */
   if( !buf ) fprintf(stderr,"** NITA: failed to realloc %d bytes\n",nbuf+1);
   return buf ;
}